

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.hpp
# Opt level: O0

void __thiscall indigox::Element::~Element(Element *this)

{
  string *in_RDI;
  
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

inline Float GetAtomicMass() const { return mass_; }